

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

local_m_map_t * __thiscall
tchecker::clockbounds::local_m_map_t::operator=(local_m_map_t *this,local_m_map_t *m)

{
  const_reference ppmVar1;
  map_t *pmVar2;
  reference ppmVar3;
  uint local_24;
  value_type pmStack_20;
  loc_id_t id;
  local_m_map_t *local_18;
  local_m_map_t *m_local;
  local_m_map_t *this_local;
  
  if (this != m) {
    local_18 = m;
    m_local = this;
    clear(this);
    this->_loc_nb = local_18->_loc_nb;
    this->_clock_nb = local_18->_clock_nb;
    pmStack_20 = (value_type)0x0;
    std::
    vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
    ::resize(&this->_M,(ulong)this->_loc_nb,&stack0xffffffffffffffe0);
    for (local_24 = 0; local_24 < this->_loc_nb; local_24 = local_24 + 1) {
      ppmVar1 = std::
                vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                ::operator[](&local_18->_M,(ulong)local_24);
      pmVar2 = clone_map(*ppmVar1);
      ppmVar3 = std::
                vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                ::operator[](&this->_M,(ulong)local_24);
      *ppmVar3 = pmVar2;
    }
  }
  return this;
}

Assistant:

tchecker::clockbounds::local_m_map_t & local_m_map_t::operator=(tchecker::clockbounds::local_m_map_t const & m)
{
  if (this != &m) {
    clear();

    _loc_nb = m._loc_nb;
    _clock_nb = m._clock_nb;
    _M.resize(_loc_nb, nullptr);
    for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id)
      _M[id] = tchecker::clockbounds::clone_map(*m._M[id]);
  }
  return *this;
}